

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependencies.h
# Opt level: O2

void __thiscall entityx::deps::Dependency<A,_B>::assign<B>(Dependency<A,_B> *this,Entity entity)

{
  bool bVar1;
  Entity local_20;
  ComponentHandle<B,_entityx::EntityManager> local_10;
  
  local_20.id_ = entity.id_.id_;
  local_20.manager_ = entity.manager_;
  local_10 = Entity::component<B,void>(&local_20);
  bVar1 = ComponentHandle<B,_entityx::EntityManager>::valid(&local_10);
  if (!bVar1) {
    Entity::assign<B>(&local_20);
  }
  return;
}

Assistant:

void assign(Entity entity) {
    if (!entity.component<D>()) entity.assign<D>();
  }